

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void runtime::deInitList<runtime::Function>
               (list<runtime::Function_*,_std::allocator<runtime::Function_*>_> *items)

{
  _List_node_base *p_Var1;
  Function *this;
  
  while (p_Var1 = (items->
                  super__List_base<runtime::Function_*,_std::allocator<runtime::Function_*>_>).
                  _M_impl._M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)items)
  {
    this = (Function *)p_Var1[1]._M_next;
    if (this != (Function *)0x0) {
      Function::~Function(this);
    }
    operator_delete(this,0x30);
    std::__cxx11::list<runtime::Function_*,_std::allocator<runtime::Function_*>_>::pop_front(items);
  }
  return;
}

Assistant:

void deInitList(std::list<T*> & items) {
  while (!items.empty()) {
    T* first = items.front();
    delete first;
    items.pop_front();
  }
}